

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_ATMOS.cpp
# Opt level: O0

h__Reader * __thiscall
ASDCP::ATMOS::MXFReader::h__Reader::MD_to_DCData_DDesc(h__Reader *this,DCDataDescriptor *DDesc)

{
  long lVar1;
  bool bVar2;
  unsigned_long_long *puVar3;
  byte_t *pbVar4;
  undefined8 *in_RDX;
  PrivateDCDataDescriptor *DDescObj;
  DCDataDescriptor *DDesc_local;
  h__Reader *this_local;
  
  if (*(long *)(DDesc[0x24].DataEssenceCoding + 0xc) == 0) {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_PTR);
  }
  else {
    lVar1 = *(long *)(DDesc[0x24].DataEssenceCoding + 0xc);
    *in_RDX = *(undefined8 *)(lVar1 + 0xf0);
    bVar2 = MXF::optional_property<unsigned_long_long>::empty
                      ((optional_property<unsigned_long_long> *)(lVar1 + 0xf8));
    if (!bVar2) {
      puVar3 = MXF::optional_property::operator_cast_to_unsigned_long_long_
                         ((optional_property *)(lVar1 + 0xf8));
      if (0xffffffff < *puVar3) {
        __assert_fail("DDescObj->ContainerDuration <= 0xFFFFFFFFL",
                      "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_ATMOS.cpp"
                      ,0x8a,
                      "ASDCP::Result_t ASDCP::ATMOS::MXFReader::h__Reader::MD_to_DCData_DDesc(ASDCP::DCData::DCDataDescriptor &)"
                     );
      }
      puVar3 = MXF::optional_property::operator_cast_to_unsigned_long_long_
                         ((optional_property *)(lVar1 + 0xf8));
      *(int *)(in_RDX + 1) = (int)*puVar3;
    }
    pbVar4 = Kumu::Identifier<16U>::Value((Identifier<16U> *)(lVar1 + 0x150));
    *(undefined8 *)((long)in_RDX + 0x1c) = *(undefined8 *)pbVar4;
    *(undefined8 *)((long)in_RDX + 0x24) = *(undefined8 *)(pbVar4 + 8);
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::ATMOS::MXFReader::h__Reader::MD_to_DCData_DDesc(ASDCP::DCData::DCDataDescriptor& DDesc)
{
  ASDCP_TEST_NULL(m_EssenceDescriptor);
  MXF::PrivateDCDataDescriptor* DDescObj = m_EssenceDescriptor;
  DDesc.EditRate = DDescObj->SampleRate;
  if ( ! DDescObj->ContainerDuration.empty() )
    {
      assert(DDescObj->ContainerDuration <= 0xFFFFFFFFL);
      DDesc.ContainerDuration = static_cast<ui32_t>(DDescObj->ContainerDuration);
    }
  memcpy(DDesc.DataEssenceCoding, DDescObj->DataEssenceCoding.Value(), SMPTE_UL_LENGTH);
  return RESULT_OK;
}